

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::Invert(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                 uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeIn;
  uint32_t rowSizeOut;
  ImageTemplate<unsigned_char> *image;
  byte bVar1;
  uint32_t uVar2;
  undefined4 in_register_00000014;
  uint32_t startX2;
  uint8_t *outY;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  uint simdWidth;
  undefined4 in_register_0000008c;
  bool bVar3;
  uint32_t local_98;
  uint local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  ulong local_70;
  ImageTemplate<unsigned_char> *local_68;
  ulong local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_0000008c,startYOut);
  local_78 = CONCAT44(in_register_00000084,startXOut);
  local_80 = CONCAT44(in_register_00000034,startXIn);
  local_90 = CONCAT44(in_register_00000014,startYIn);
  local_60 = (ulong)height;
  local_70 = (ulong)width;
  do {
    bVar1 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
    if (simdType == cpu_function) break;
    uVar2 = getSimdSize(simdType);
    local_94 = bVar1 * (uint32_t)local_70;
    if (uVar2 <= local_94) {
      local_98 = (uint32_t)local_60;
      startX2 = (uint32_t)local_78;
      local_68 = in;
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,(uint32_t)local_80,(uint32_t)local_90,out,startX2,(uint32_t)local_88,
                 (uint32_t)local_70,local_98);
      image = local_68;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_94,&local_98,image,&local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
      rowSizeIn = image->_rowSize;
      rowSizeOut = out->_rowSize;
      simdWidth = local_94 / uVar2;
      outY = out->_data + (ulong)(startX2 * bVar1) + (ulong)((int)local_88 * rowSizeOut);
      if (simdType == sse_function) {
        sse::Invert(rowSizeIn,rowSizeOut,
                    image->_data +
                    (ulong)((int)local_80 * (uint)bVar1) + (ulong)((int)local_90 * rowSizeIn),outY,
                    outY + local_98 * rowSizeOut,simdWidth,simdWidth * uVar2,local_94 % uVar2);
      }
      else if (simdType == avx_function) {
        avx::Invert(rowSizeIn,rowSizeOut,
                    image->_data +
                    (ulong)((int)local_80 * (uint)bVar1) + (ulong)((int)local_90 * rowSizeIn),outY,
                    outY + local_98 * rowSizeOut,simdWidth,simdWidth * uVar2,local_94 % uVar2);
      }
      return;
    }
    bVar3 = simdType == avx_function;
    simdType = sse_function;
  } while (bVar3);
  Image_Function::Invert
            (in,(uint32_t)local_80,(uint32_t)local_90,out,(uint32_t)local_78,(uint32_t)local_88,
             width,height);
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }